

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_set_mv_search_params(AV1_COMP *cpi)

{
  int iVar1;
  int size;
  int iVar2;
  
  iVar1 = (cpi->common).width;
  size = (cpi->common).height;
  if (size < iVar1) {
    size = iVar1;
  }
  iVar1 = av1_init_search_range(size);
  (cpi->mv_search_params).mv_step_param = iVar1;
  iVar1 = (cpi->sf).mv_sf.auto_mv_step_size;
  if (iVar1 != 0) {
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      if ((((cpi->common).show_frame != 0) ||
          ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x06')) &&
         (iVar2 = (cpi->mv_search_params).max_mv_magnitude, 1 < iVar1 && iVar2 != -1)) {
        iVar2 = iVar2 * 2;
        if (size < iVar2) {
          iVar2 = size;
        }
        iVar1 = av1_init_search_range(iVar2);
        (cpi->mv_search_params).mv_step_param = iVar1;
      }
      size = -1;
      if (cpi->do_frame_data_update != true) {
        return;
      }
    }
    (cpi->mv_search_params).max_mv_magnitude = size;
  }
  return;
}

Assistant:

void av1_set_mv_search_params(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  MotionVectorSearchParams *const mv_search_params = &cpi->mv_search_params;
  const int max_mv_def = AOMMAX(cm->width, cm->height);

  // Default based on max resolution.
  mv_search_params->mv_step_param = av1_init_search_range(max_mv_def);

  if (cpi->sf.mv_sf.auto_mv_step_size) {
    if (frame_is_intra_only(cm)) {
      // Initialize max_mv_magnitude for use in the first INTER frame
      // after a key/intra-only frame.
      mv_search_params->max_mv_magnitude = max_mv_def;
    } else {
      // Use adaptive mv steps based on previous frame stats for show frames and
      // internal arfs.
      FRAME_UPDATE_TYPE cur_update_type =
          cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
      int use_auto_mv_step =
          (cm->show_frame || cur_update_type == INTNL_ARF_UPDATE) &&
          mv_search_params->max_mv_magnitude != -1 &&
          cpi->sf.mv_sf.auto_mv_step_size >= 2;
      if (use_auto_mv_step) {
        // Allow mv_steps to correspond to twice the max mv magnitude found
        // in the previous frame, capped by the default max_mv_magnitude based
        // on resolution.
        mv_search_params->mv_step_param = av1_init_search_range(
            AOMMIN(max_mv_def, 2 * mv_search_params->max_mv_magnitude));
      }
      // Reset max_mv_magnitude based on update flag.
      if (cpi->do_frame_data_update) mv_search_params->max_mv_magnitude = -1;
    }
  }
}